

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_utf8_copy_num(char *dst,char *src,int dst_size,int num)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int cursor;
  int new_cursor;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_20;
  int local_18;
  
  local_20 = 0;
  dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(char *)0x2596c7);
  local_18 = in_ECX;
  while ((in_RSI[local_20] != '\0' && 0 < local_18 &&
         (iVar1 = str_utf8_forward(in_RSI,local_20), iVar1 < in_EDX))) {
    local_18 = local_18 + -1;
    local_20 = iVar1;
  }
  if (local_20 < in_EDX) {
    in_EDX = local_20 + 1;
  }
  str_copy((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
           (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  return;
}

Assistant:

void str_utf8_copy_num(char *dst, const char *src, int dst_size, int num)
{
	int new_cursor;
	int cursor = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");

	while(src[cursor] && num > 0)
	{
		new_cursor = str_utf8_forward(src, cursor);
		if(new_cursor >= dst_size)			// reserve 1 byte for the null termination
			break;
		else
			cursor = new_cursor;
		--num;
	}

	str_copy(dst, src, cursor < dst_size ? cursor+1 : dst_size);
}